

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  int iVar1;
  int iVar2;
  Db *pDVar3;
  int iVar4;
  bool bVar5;
  
  if (zName == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar4 = db->nDb + -1;
    pDVar3 = db->aDb + iVar4;
    iVar2 = -1;
    if (iVar4 < -1) {
      iVar2 = iVar4;
    }
    while( true ) {
      if (iVar4 < 0) {
        return iVar2;
      }
      iVar1 = sqlite3_stricmp(pDVar3->zDbSName,zName);
      if (iVar1 == 0) {
        return iVar4;
      }
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if ((bVar5) && (iVar1 = sqlite3StrICmp("main",zName), iVar1 == 0)) break;
      pDVar3 = pDVar3 + -1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}